

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O1

Read<long> __thiscall
Omega_h::map_onto<long>(Omega_h *this,Read<long> *a_data,Graph *a2b,LO nb,long init_val,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *this_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar3;
  Read<long> RVar4;
  Write<long> out;
  Write<long> local_b8;
  Write<long> local_a8;
  Read<long> local_98;
  Write<long> local_88;
  Graph local_78;
  Alloc *local_58;
  string local_50;
  
  local_58 = (Alloc *)this;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  Write<long>::Write(&local_b8,nb * width,init_val,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_98.write_.shared_alloc_.alloc = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc =
           (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_98.write_.shared_alloc_.alloc)->use_count =
           (local_98.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = (a_data->write_).shared_alloc_.direct_ptr;
  local_78.a2ab.write_.shared_alloc_.alloc = (a2b->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_78.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_78.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_78.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78.a2ab.write_.shared_alloc_.direct_ptr = (a2b->a2ab).write_.shared_alloc_.direct_ptr;
  local_78.ab2b.write_.shared_alloc_.alloc = (a2b->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_78.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_78.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_78.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78.ab2b.write_.shared_alloc_.direct_ptr = (a2b->ab2b).write_.shared_alloc_.direct_ptr;
  local_88.shared_alloc_.alloc = local_b8.shared_alloc_.alloc;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_88.shared_alloc_.alloc = (Alloc *)((local_b8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b8.shared_alloc_.alloc)->use_count = (local_b8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.shared_alloc_.direct_ptr = local_b8.shared_alloc_.direct_ptr;
  map_into<long>(&local_98,&local_78,&local_88,width);
  this_00 = local_58;
  pAVar2 = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_78.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_78.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.ab2b.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.ab2b.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_78.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_78.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.a2ab.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.a2ab.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_a8.shared_alloc_.alloc = local_b8.shared_alloc_.alloc;
  local_a8.shared_alloc_.direct_ptr = local_b8.shared_alloc_.direct_ptr;
  if ((((ulong)local_b8.shared_alloc_.alloc & 7) == 0 &&
       local_b8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_b8.shared_alloc_.alloc)->use_count = (local_b8.shared_alloc_.alloc)->use_count + -1;
    local_a8.shared_alloc_.alloc = (Alloc *)((local_b8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_b8.shared_alloc_.alloc = (Alloc *)0x0;
  local_b8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<long>::Read((Read<signed_char> *)this_00,&local_a8);
  pAVar2 = local_a8.shared_alloc_.alloc;
  pvVar3 = extraout_RDX;
  if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 && local_a8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  pAVar2 = local_b8.shared_alloc_.alloc;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_b8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = this_00;
  return (Read<long>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<T> map_onto(Read<T> a_data, Graph a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  map_into(a_data, a2b, out, width);
  return out;
}